

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void P_UnPredictPlayer(void)

{
  undefined4 uVar1;
  APlayerPawn *this;
  anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 aVar2;
  sector_t *psVar3;
  AActor *pAVar4;
  AActor *pAVar5;
  msecnode_t *pmVar6;
  sector_t_conflict **ppsVar7;
  AActor **ppAVar8;
  msecnode_t **ppmVar9;
  long lVar10;
  long lVar11;
  AActor **ppAVar12;
  msecnode_t *pmVar13;
  FBlockNode *pFVar14;
  ulong uVar15;
  msecnode_t **ppmVar16;
  long lVar17;
  FLinkContext ctx;
  FLinkContext local_38;
  
  lVar10 = (long)consoleplayer;
  lVar11 = lVar10 * 0x2a0;
  if ((*(byte *)((long)&DAT_017e5f38 + lVar11 + 1) & 0x20) != 0) {
    this = ((player_t *)(&players + lVar10 * 0x54))->mo;
    lVar17 = (&DAT_017e5fc8)[lVar10 * 0x54];
    if ((lVar17 != 0) && ((*(byte *)(lVar17 + 0x20) & 0x20) != 0)) {
      (&DAT_017e5fc8)[lVar10 * 0x54] = 0;
      lVar17 = 0;
    }
    aVar2 = (this->InvSel).field_0;
    uVar1 = *(undefined4 *)(&DAT_017e5eec + lVar11);
    player_t::operator=((player_t *)(&players + lVar10 * 0x54),&PredictionPlayerBackup);
    (&DAT_017e5fc8)[lVar10 * 0x54] = lVar17;
    local_38.sector_list = (msecnode_t *)0x0;
    local_38.render_list = (msecnode_t *)0x0;
    AActor::UnlinkFromWorld(&this->super_AActor,&local_38);
    memcpy(&(this->super_AActor).snext,PredictionActorBackup,0x530);
    if (((this->super_AActor).flags.Value & 8) == 0) {
      psVar3 = (this->super_AActor).Sector;
      psVar3->thinglist = (AActor *)0x0;
      ppAVar8 = PredictionSectorListBackup.Array;
      uVar15 = (ulong)PredictionSectorListBackup.Count;
      pmVar13 = local_38.sector_list;
      if (uVar15 != 0) {
        ppAVar12 = &psVar3->thinglist;
        do {
          pAVar4 = ppAVar8[uVar15 - 1];
          pAVar5 = *ppAVar12;
          pAVar4->snext = pAVar5;
          if (pAVar5 != (AActor *)0x0) {
            pAVar5->sprev = &pAVar4->snext;
          }
          pAVar4->sprev = ppAVar12;
          *ppAVar12 = pAVar4;
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
      }
      for (; pmVar13 != (msecnode_t *)0x0; pmVar13 = pmVar13->m_tnext) {
        pmVar13->m_thing = (AActor *)0x0;
      }
      P_DelSeclist(local_38.sector_list,0x1c0);
      local_38.sector_list = (msecnode_t *)0x0;
      for (uVar15 = (ulong)PredictionTouchingSectorsBackup.Count; uVar15 != 0; uVar15 = uVar15 - 1)
      {
        local_38.sector_list =
             P_AddSecnode(PredictionTouchingSectorsBackup.Array[uVar15 - 1],&this->super_AActor,
                          local_38.sector_list,
                          &PredictionTouchingSectorsBackup.Array[uVar15 - 1]->touching_thinglist);
      }
      (this->super_AActor).touching_sectorlist = local_38.sector_list;
      ppmVar9 = PredictionSector_sprev_Backup.Array;
      ppsVar7 = PredictionTouchingSectorsBackup.Array;
      for (uVar15 = (ulong)PredictionTouchingSectorsBackup.Count; uVar15 != 0; uVar15 = uVar15 - 1)
      {
        if (ppmVar9[uVar15 - 1] != (msecnode_t *)0x0) {
          for (pmVar13 = ppsVar7[uVar15 - 1]->touching_thinglist; pmVar13 != (msecnode_t *)0x0;
              pmVar13 = pmVar13->m_snext) {
            if ((APlayerPawn *)pmVar13->m_thing == this) {
              pmVar6 = pmVar13->m_sprev;
              if (pmVar6 == (msecnode_t *)0x0) {
                ppmVar16 = &pmVar13->m_sector->touching_thinglist;
              }
              else {
                ppmVar16 = &pmVar6->m_snext;
              }
              *ppmVar16 = pmVar13->m_snext;
              if (pmVar13->m_snext != (msecnode_t *)0x0) {
                pmVar13->m_snext->m_sprev = pmVar6;
              }
              pmVar6 = ppmVar9[uVar15 - 1];
              pmVar13->m_sprev = pmVar6;
              pmVar6 = pmVar6->m_snext;
              if (pmVar6 != (msecnode_t *)0x0) {
                pmVar6->m_sprev = pmVar13;
              }
              pmVar13->m_snext = pmVar13->m_sprev->m_snext;
              pmVar13->m_sprev->m_snext = pmVar13;
              break;
            }
          }
        }
      }
    }
    for (pFVar14 = (this->super_AActor).BlockNode; pFVar14 != (FBlockNode *)0x0;
        pFVar14 = pFVar14->NextBlock) {
      *pFVar14->PrevActor = pFVar14;
      if (pFVar14->NextActor != (FBlockNode *)0x0) {
        pFVar14->NextActor->PrevActor = &pFVar14->NextActor;
      }
    }
    (this->InvSel).field_0 = aVar2;
    *(undefined4 *)(&DAT_017e5eec + lVar11) = uVar1;
  }
  return;
}

Assistant:

void P_UnPredictPlayer ()
{
	player_t *player = &players[consoleplayer];

	if (player->cheats & CF_PREDICTING)
	{
		unsigned int i;
		APlayerPawn *act = player->mo;
		AActor *savedcamera = player->camera;

		TObjPtr<AInventory> InvSel = act->InvSel;
		int inventorytics = player->inventorytics;

		*player = PredictionPlayerBackup;

		// Restore the camera instead of using the backup's copy, because spynext/prev
		// could cause it to change during prediction.
		player->camera = savedcamera;

		FLinkContext ctx;
		act->UnlinkFromWorld(&ctx);
		memcpy(&act->snext, PredictionActorBackup, sizeof(APlayerPawn) - ((BYTE *)&act->snext - (BYTE *)act));

		// The blockmap ordering needs to remain unchanged, too.
		// Restore sector links and refrences.
		// [ED850] This is somewhat of a duplicate of LinkToWorld(), but we need to keep every thing the same,
		// otherwise we end up fixing bugs in blockmap logic (i.e undefined behaviour with polyobject collisions),
		// which we really don't want to do here.
		if (!(act->flags & MF_NOSECTOR))
		{
			sector_t *sec = act->Sector;
			AActor *me, *next;
			AActor **link;// , **prev;

			// The thinglist is just a pointer chain. We are restoring the exact same things, so we can NULL the head safely
			sec->thinglist = NULL;

			for (i = PredictionSectorListBackup.Size(); i-- > 0;)
			{
				me = PredictionSectorListBackup[i];
				link = &sec->thinglist;
				next = *link;
				if ((me->snext = next))
					next->sprev = &me->snext;
				me->sprev = link;
				*link = me;
			}

			// Destroy old refrences
			msecnode_t *node = ctx.sector_list;
			while (node)
			{
				node->m_thing = NULL;
				node = node->m_tnext;
			}

			// Make the sector_list match the player's touching_sectorlist before it got predicted.
			P_DelSeclist(ctx.sector_list, &sector_t::touching_thinglist);
			ctx.sector_list = NULL;
			for (i = PredictionTouchingSectorsBackup.Size(); i-- > 0;)
			{
				ctx.sector_list = P_AddSecnode(PredictionTouchingSectorsBackup[i], act, ctx.sector_list, PredictionTouchingSectorsBackup[i]->touching_thinglist);
			}
			act->touching_sectorlist = ctx.sector_list;	// Attach to thing
			ctx.sector_list = NULL;		// clear for next time

			// Huh???
			node = ctx.sector_list;
			while (node)
			{
				if (node->m_thing == NULL)
				{
					if (node == ctx.sector_list)
						ctx.sector_list = node->m_tnext;
					node = P_DelSecnode(node, &sector_t::touching_thinglist);
				}
				else
				{
					node = node->m_tnext;
				}
			}

			msecnode_t *snode;

			// Restore sector thinglist order
			for (i = PredictionTouchingSectorsBackup.Size(); i-- > 0;)
			{
				// If we were already the head node, then nothing needs to change
				if (PredictionSector_sprev_Backup[i] == NULL)
					continue;

				for (snode = PredictionTouchingSectorsBackup[i]->touching_thinglist; snode; snode = snode->m_snext)
				{
					if (snode->m_thing == act)
					{
						if (snode->m_sprev)
							snode->m_sprev->m_snext = snode->m_snext;
						else
							snode->m_sector->touching_thinglist = snode->m_snext;
						if (snode->m_snext)
							snode->m_snext->m_sprev = snode->m_sprev;

						snode->m_sprev = PredictionSector_sprev_Backup[i];

						// At the moment, we don't exist in the list anymore, but we do know what our previous node is, so we set its current m_snext->m_sprev to us.
						if (snode->m_sprev->m_snext)
							snode->m_sprev->m_snext->m_sprev = snode;
						snode->m_snext = snode->m_sprev->m_snext;
						snode->m_sprev->m_snext = snode;
						break;
					}
				}
			}
		}

		// Now fix the pointers in the blocknode chain
		FBlockNode *block = act->BlockNode;

		while (block != NULL)
		{
			*(block->PrevActor) = block;
			if (block->NextActor != NULL)
			{
				block->NextActor->PrevActor = &block->NextActor;
			}
			block = block->NextBlock;
		}

		act->InvSel = InvSel;
		player->inventorytics = inventorytics;
	}
}